

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void handle_C_option(char *z)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char **ppcVar6;
  ulong uVar7;
  FILE *__stream;
  int iVar8;
  long lVar9;
  s_options *psVar10;
  int n;
  char *pcVar11;
  char **ppcVar12;
  long lVar13;
  double dVar14;
  char *pcStack_90;
  char **ppcStack_88;
  double dStack_80;
  char **ppcStack_78;
  long lStack_70;
  
  sVar4 = strlen(z);
  lVar9 = sVar4 << 0x20;
  pcVar11 = (char *)(lVar9 + 0x200000000 >> 0x20);
  pcVar5 = (char *)malloc((size_t)pcVar11);
  output_dir = pcVar5;
  if (pcVar5 != (char *)0x0) {
    strcpy(pcVar5,z);
    if (pcVar5[lVar9 + -0x100000000 >> 0x20] != '/') {
      pcVar5[lVar9 >> 0x20] = '/';
      pcVar5[lVar9 + 0x100000000 >> 0x20] = '\0';
    }
    return;
  }
  handle_C_option_cold_1();
  lVar9 = (long)nDefine;
  nDefine = nDefine + 1;
  psVar10 = (s_options *)(lVar9 * 8 + 8);
  ppcVar6 = (char **)realloc(azDefine,(size_t)psVar10);
  if (ppcVar6 == (char **)0x0) {
    ppcVar12 = azDefine;
    azDefine = ppcVar6;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar6;
    sVar4 = strlen(pcVar11);
    ppcVar12 = (char **)(long)((int)sVar4 + 1);
    pcVar5 = (char *)malloc((size_t)ppcVar12);
    ppcVar6[lVar9] = pcVar5;
    if (pcVar5 != (char *)0x0) {
      strcpy(pcVar5,pcVar11);
      for (; (*pcVar5 != '\0' && (*pcVar5 != '=')); pcVar5 = pcVar5 + 1) {
      }
      *pcVar5 = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar4 = strlen((char *)ppcVar12);
  ppcVar6 = (char **)(long)((int)sVar4 + 1);
  user_templatename = (char *)malloc((size_t)ppcVar6);
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)ppcVar12);
    return;
  }
  handle_T_option_cold_1();
  argv = ppcVar6;
  op = psVar10;
  errstream = (FILE *)__stream;
  if ((((ppcVar6 != (char **)0x0) && (psVar10 != (s_options *)0x0)) && (*ppcVar6 != (char *)0x0)) &&
     (pcVar5 = ppcVar6[1], pcVar5 != (char *)0x0)) {
    lVar13 = 1;
    iVar8 = 0;
    ppcStack_88 = ppcVar6;
    ppcStack_78 = ppcVar12;
    lStack_70 = lVar9;
    do {
      psVar10 = op;
      ppcVar6 = argv;
      n = (int)lVar13;
      if ((*pcVar5 == '-') || (*pcVar5 == '+')) {
        pcVar5 = op->label;
        if (pcVar5 == (char *)0x0) {
          lVar9 = 0;
        }
        else {
          pcVar11 = argv[lVar13];
          ppcVar12 = &op[1].label;
          lVar9 = 0;
          do {
            sVar4 = strlen(pcVar5);
            iVar3 = strncmp(pcVar11 + 1,pcVar5,(long)(int)sVar4);
            if (iVar3 == 0) break;
            lVar9 = lVar9 + 1;
            pcVar5 = *ppcVar12;
            ppcVar12 = ppcVar12 + 4;
          } while (pcVar5 != (char *)0x0);
        }
        if (psVar10[lVar9].label == (char *)0x0) {
          if (__stream == (FILE *)0x0) {
LAB_00105fc6:
            iVar3 = 1;
          }
          else {
            pcVar5 = "%sundefined option.\n";
LAB_00105fa1:
            fprintf(__stream,pcVar5,emsg);
            iVar3 = 1;
            errline(n,1,(FILE *)__stream);
          }
        }
        else {
          psVar10 = psVar10 + lVar9;
          pcVar2 = (code *)psVar10->arg;
          iVar3 = 0;
          if (pcVar2 != (code *)0x0) {
            oVar1 = psVar10->type;
            if (oVar1 == OPT_FSTR) {
              (*pcVar2)(ppcVar6[lVar13] + 2);
            }
            else if (oVar1 == OPT_FFLAG) {
              (*pcVar2)();
            }
            else {
              if (oVar1 != OPT_FLAG) {
                if (__stream == (FILE *)0x0) goto LAB_00105fc6;
                pcVar5 = "%smissing argument on switch.\n";
                goto LAB_00105fa1;
              }
              *(uint *)pcVar2 = (uint)(*ppcVar6[lVar13] == '-');
            }
          }
        }
        iVar8 = iVar8 + iVar3;
      }
      else {
        pcVar5 = strchr(pcVar5,0x3d);
        if (pcVar5 != (char *)0x0) {
          pcVar5 = strchr(ppcVar6[lVar13],0x3d);
          if (pcVar5 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x78a,"int handleswitch(int, FILE *)");
          }
          *pcVar5 = '\0';
          psVar10 = op;
          pcVar11 = op->label;
          if (pcVar11 == (char *)0x0) {
            lVar9 = 0;
          }
          else {
            __s1 = ppcVar6[lVar13];
            ppcVar6 = &op[1].label;
            lVar9 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar11);
              if (iVar3 == 0) break;
              lVar9 = lVar9 + 1;
              pcVar11 = *ppcVar6;
              ppcVar6 = ppcVar6 + 4;
            } while (pcVar11 != (char *)0x0);
          }
          *pcVar5 = '=';
          if (psVar10[lVar9].label == (char *)0x0) {
            iVar3 = 1;
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"%sundefined option.\n",emsg);
              errline(n,0,(FILE *)__stream);
            }
          }
          else {
            oVar1 = psVar10[lVar9].type;
            dVar14 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar5 = pcVar5 + 1;
              switch(oVar1) {
              default:
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"%soption requires an argument.\n",emsg);
                  errline(n,0,(FILE *)__stream);
                  dVar14 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar7 = strtol(pcVar5,&pcStack_90,0);
                pcVar5 = pcStack_90;
                if ((*pcStack_90 != '\0') && (iVar3 = 1, __stream != (FILE *)0x0)) {
                  fprintf(__stream,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar5 - *(int *)(argv + lVar13),(FILE *)__stream);
                }
                pcVar5 = (char *)0x0;
                dVar14 = 0.0;
                goto LAB_001060ab;
              case OPT_DBL:
              case OPT_FDBL:
                dVar14 = strtod(pcVar5,&pcStack_90);
                pcVar5 = pcStack_90;
                if (*pcStack_90 == '\0') goto LAB_001060a6;
                if (__stream != (FILE *)0x0) {
                  dStack_80 = dVar14;
                  fprintf(__stream,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar5 - *(int *)(argv + lVar13),(FILE *)__stream);
                  dVar14 = dStack_80;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105f02_caseD_4;
              }
              uVar7 = 0;
              iVar3 = 1;
              pcVar5 = (char *)0x0;
            }
            else {
LAB_001060a6:
              pcVar5 = (char *)0x0;
switchD_00105f02_caseD_4:
              uVar7 = 0;
              iVar3 = 0;
            }
LAB_001060ab:
            switch(op[lVar9].type) {
            case OPT_INT:
              *(int *)op[lVar9].arg = (int)uVar7;
              break;
            case OPT_DBL:
              *(double *)op[lVar9].arg = dVar14;
              break;
            case OPT_STR:
              *(char **)op[lVar9].arg = pcVar5;
              break;
            case OPT_FINT:
              (*(code *)op[lVar9].arg)(uVar7 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar9].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar9].arg)(pcVar5);
            }
          }
          iVar8 = iVar3 + iVar8;
        }
      }
      pcVar5 = argv[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while (pcVar5 != (char *)0x0);
    if (0 < iVar8) {
      fprintf(__stream,"Valid command line options for \"%s\" are:\n",*ppcStack_88);
      OptPrint();
      exit(1);
    }
  }
  return;
}

Assistant:

static void handle_C_option(char *z){
  int len = lemonStrlen(z);
  output_dir = (char *) malloc( len+2 );
  if( output_dir==0 ){
    memory_error();
  }
  strcpy(output_dir, z);
  if( !is_seperator(output_dir[len-1]) ){
    output_dir[len] = '/';
    output_dir[len+1] = '\0';
  }
}